

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall QMainWindowTabBar::event(QMainWindowTabBar *this,QEvent *e)

{
  bool bVar1;
  Shape SVar2;
  QSize QVar3;
  ulong uVar4;
  
  if (*(short *)(e + 8) != 0x6e) goto LAB_00402791;
  QVar3 = QWidget::size((QWidget *)this);
  uVar4 = (**(code **)(*(long *)this + 0x70))(this);
  SVar2 = QTabBar::shape((QTabBar *)this);
  if (SVar2 == RoundedWest) {
LAB_00402784:
    QVar3 = (QSize)((ulong)QVar3 >> 0x20);
    uVar4 = uVar4 >> 0x20;
  }
  else {
    SVar2 = QTabBar::shape((QTabBar *)this);
    if (SVar2 == RoundedEast) goto LAB_00402784;
  }
  if ((int)uVar4 <= QVar3.wd.m_i.m_i) {
    e[0xc] = (QEvent)0x1;
    return true;
  }
LAB_00402791:
  bVar1 = QTabBar::event((QTabBar *)this,e);
  return bVar1;
}

Assistant:

bool QMainWindowTabBar::event(QEvent *e)
{
    // show the tooltip if tab is too small to fit label

    if (e->type() != QEvent::ToolTip)
        return QTabBar::event(e);
    QSize size = this->size();
    QSize hint = sizeHint();
    if (shape() == QTabBar::RoundedWest || shape() == QTabBar::RoundedEast) {
        size = size.transposed();
        hint = hint.transposed();
    }
    if (size.width() < hint.width())
        return QTabBar::event(e);
    e->accept();
    return true;
}